

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void cleanup(EVP_PKEY_CTX *ctx)

{
  void *__ptr;
  
  __ptr = *(void **)(ctx + 0x40);
  if ((((byte)ctx[0x3c] & 8) != 0) && (*(void **)((long)__ptr + 0x38) != (void *)0x0)) {
    free(*(void **)((long)__ptr + 0x38));
  }
  if (*(void **)((long)__ptr + 0x30) != (void *)0x0) {
    free(*(void **)((long)__ptr + 0x30));
  }
  free(__ptr);
  return;
}

Assistant:

static void cleanup(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (strm->flags & AEC_DATA_PREPROCESS && state->data_raw)
        free(state->data_raw);
    if (state->data_pp)
        free(state->data_pp);
    free(state);
}